

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListOperation<int,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<int,duckdb::QuantileStandardType>>
               (QuantileState<int,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  _func_int **pp_Var2;
  int iVar3;
  FunctionData *pFVar4;
  Vector *pVVar5;
  idx_t iVar6;
  reference pvVar7;
  uint64_t uVar8;
  ulong uVar9;
  unsigned_long *q;
  _func_int **pp_Var10;
  double dVar11;
  undefined1 auVar12 [16];
  QuantileDirect<int> local_a9;
  list_entry_t *local_a8;
  AggregateFinalizeData *local_a0;
  data_ptr_t local_98;
  pointer local_90;
  vector<duckdb::QuantileValue,_true> *local_88;
  Vector *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    pFVar4 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar5 = ListVector::GetEntry(finalize_data->result);
    iVar6 = ListVector::GetListSize(finalize_data->result);
    local_88 = (vector<duckdb::QuantileValue,_true> *)(pFVar4 + 1);
    local_a0 = finalize_data;
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar4[2]._vptr_FunctionData - (long)pFVar4[1]._vptr_FunctionData) /
                        0x68 + iVar6);
    local_90 = (state->v).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_98 = pVVar5->data + iVar6 * 4;
    target->offset = iVar6;
    pp_Var2 = pFVar4[5]._vptr_FunctionData;
    uVar9 = 0;
    local_a8 = target;
    local_80 = pVVar5;
    for (pp_Var10 = pFVar4[4]._vptr_FunctionData; pp_Var10 != pp_Var2; pp_Var10 = pp_Var10 + 1) {
      pvVar7 = vector<duckdb::QuantileValue,_true>::get<true>(local_88,(size_type)*pp_Var10);
      iVar6 = (long)(state->v).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(state->v).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2;
      local_78.desc = *(bool *)&pFVar4[7]._vptr_FunctionData;
      lVar1 = iVar6 - 1;
      auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar12._0_8_ = lVar1;
      auVar12._12_4_ = 0x45300000;
      dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
      local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                    pvVar7->dbl;
      local_48 = local_78.RN;
      dVar11 = floor(local_78.RN);
      local_78.FRN = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
      dVar11 = ceil(local_48);
      local_78.CRN = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
      local_78.begin = uVar9;
      local_78.end = iVar6;
      iVar3 = Interpolator<false>::Operation<int,int,duckdb::QuantileDirect<int>>
                        (&local_78,local_90,local_80,&local_a9);
      *(int *)(local_98 + (long)*pp_Var10 * 4) = iVar3;
      uVar9 = local_78.FRN;
    }
    uVar8 = ((long)pFVar4[2]._vptr_FunctionData - (long)pFVar4[1]._vptr_FunctionData) / 0x68;
    local_a8->length = uVar8;
    ListVector::SetListSize(local_a0->result,uVar8 + local_a8->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}